

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleTestMode(cmSetPropertyCommand *this)

{
  cmMakefile *this_00;
  bool bVar1;
  cmTest *test_00;
  ostream *poVar2;
  reference pbVar3;
  string local_200;
  _Self local_1e0;
  _Self local_1d8;
  const_iterator ni_1;
  undefined1 local_1c0 [8];
  ostringstream e;
  cmTest *test;
  _Self local_28;
  iterator ni;
  iterator next;
  cmSetPropertyCommand *this_local;
  
  std::
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Rb_tree_const_iterator(&ni);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Names);
  do {
    test = (cmTest *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Names);
    bVar1 = std::operator!=(&local_28,(_Self *)&test);
    if (!bVar1) {
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->Names);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::operator<<((ostream *)local_1c0,"given TEST names that do not exist:\n");
        local_1d8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Names);
        while( true ) {
          local_1e0._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->Names);
          bVar1 = std::operator!=(&local_1d8,&local_1e0);
          if (!bVar1) break;
          poVar2 = std::operator<<((ostream *)local_1c0,"  ");
          pbVar3 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_1d8);
          poVar2 = std::operator<<(poVar2,(string *)pbVar3);
          std::operator<<(poVar2,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_1d8);
        }
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        this_local._7_1_ = false;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      }
      return this_local._7_1_;
    }
    ni._M_node = local_28._M_node;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&ni);
    this_00 = (this->super_cmCommand).Makefile;
    pbVar3 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    test_00 = cmMakefile::GetTest(this_00,pbVar3);
    if (test_00 != (cmTest *)0x0) {
      bVar1 = HandleTest(this,test_00);
      if (!bVar1) {
        return false;
      }
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::erase_abi_cxx11_((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->Names,(const_iterator)local_28._M_node);
    }
    local_28._M_node = ni._M_node;
  } while( true );
}

Assistant:

bool cmSetPropertyCommand::HandleTestMode()
{
  // Look for tests with all names given.
  std::set<std::string>::iterator next;
  for(std::set<std::string>::iterator ni = this->Names.begin();
      ni != this->Names.end(); ni = next)
    {
    next = ni;
    ++next;
    if(cmTest* test = this->Makefile->GetTest(*ni))
      {
      if(this->HandleTest(test))
        {
        this->Names.erase(ni);
        }
      else
        {
        return false;
        }
      }
    }

  // Names that are still left were not found.
  if(!this->Names.empty())
    {
    std::ostringstream e;
    e << "given TEST names that do not exist:\n";
    for(std::set<std::string>::const_iterator ni = this->Names.begin();
        ni != this->Names.end(); ++ni)
      {
      e << "  " << *ni << "\n";
      }
    this->SetError(e.str());
    return false;
    }
  return true;
}